

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

QWidget * __thiscall QAbstractItemView::indexWidget(QAbstractItemView *this,QModelIndex *index)

{
  Data *pDVar1;
  QWidget *pQVar2;
  QEditorInfo *pQVar3;
  
  if (((-1 < index->r) && (-1 < index->c)) &&
     ((index->m).ptr == (*(QAbstractItemViewPrivate **)(this + 8))->model)) {
    pQVar3 = QAbstractItemViewPrivate::editorForIndex
                       (*(QAbstractItemViewPrivate **)(this + 8),index);
    pDVar1 = (pQVar3->widget).wp.d;
    if ((pDVar1 != (Data *)0x0) &&
       (pQVar2 = (QWidget *)(pQVar3->widget).wp.value,
       pQVar2 != (QWidget *)0x0 && *(int *)(pDVar1 + 4) != 0)) {
      return pQVar2;
    }
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget* QAbstractItemView::indexWidget(const QModelIndex &index) const
{
    Q_D(const QAbstractItemView);
    if (d->isIndexValid(index))
        if (QWidget *editor = d->editorForIndex(index).widget.data())
            return editor;

    return nullptr;
}